

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O1

bool __thiscall
ScannedObject<51U,_1000U>::TryGetRandomLocation(ScannedObject<51U,_1000U> *this,Location *location)

{
  uint uVar1;
  uint uVar2;
  IRecyclerVisitedObject *pIVar3;
  size_t sVar4;
  Location *object;
  ScannedObject<51U,_1000U> *pSVar5;
  ulong uVar6;
  
  uVar1 = this->count;
  object = location;
  pSVar5 = this;
  uVar2 = PAL_rand();
  pIVar3 = &this[1].super_RecyclerTestObject.super_IRecyclerVisitedObject +
           (ulong)uVar2 % (ulong)uVar1;
  if (pIVar3 != (IRecyclerVisitedObject *)0x0) {
    location->location = (RecyclerTestObject **)pIVar3;
    location->type = Scanned;
    return true;
  }
  ScannedObject<51u,1000u>::TryGetRandomLocation();
  sVar4 = RecyclerTestObject::walkScannedByteCount + (ulong)pSVar5->count * 8 + 0x18;
  RecyclerTestObject::walkScannedByteCount = sVar4;
  if (pSVar5->count != 0) {
    uVar6 = 0;
    do {
      RecyclerTestObject::WalkReference
                ((RecyclerTestObject *)
                 (&pSVar5[1].super_RecyclerTestObject.super_IRecyclerVisitedObject)[uVar6].
                 _vptr_IRecyclerVisitedObject,(RecyclerTestObject *)object);
      uVar6 = uVar6 + 1;
      sVar4 = (size_t)pSVar5->count;
    } while (uVar6 < sVar4);
  }
  return SUB81(sVar4,0);
}

Assistant:

virtual bool TryGetRandomLocation(Location * location) override
    {
        // Get a random slot and construct a Location for it
        *location = Location::Scanned(&references[GetRandomInteger(count)]);

        return true;
    }